

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QByteArray>::eraseFirst(QGenericArrayOps<QByteArray> *this)

{
  QByteArray **ppQVar1;
  qsizetype *pqVar2;
  
  QArrayDataPointer<char>::~QArrayDataPointer(&((this->super_QArrayDataPointer<QByteArray>).ptr)->d)
  ;
  ppQVar1 = &(this->super_QArrayDataPointer<QByteArray>).ptr;
  *ppQVar1 = *ppQVar1 + 1;
  pqVar2 = &(this->super_QArrayDataPointer<QByteArray>).size;
  *pqVar2 = *pqVar2 + -1;
  return;
}

Assistant:

void eraseFirst() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        this->begin()->~T();
        ++this->ptr;
        --this->size;
    }